

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O2

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::
detach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
       *this,ObserverBase *observer)

{
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  std::__cxx11::
  list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
  ::erase(&this->_observers,(observer->_index)._M_node);
  (observer->_index)._M_node = (_List_node_base *)&this->_observers;
  observer->_notifier = (Notifier *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

void detach(ObserverBase& observer) {
    _lock.lock();
    _observers.erase(observer._index);
    observer._index    = _observers.end();
    observer._notifier = 0;
    _lock.unlock();
  }